

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

void prvTidyFreeTags(TidyDocImpl *doc)

{
  tagsEmptyHash(doc,&doc->tags);
  prvTidyFreeDeclaredTags(doc,tagtype_null);
  FreeDict(doc,(doc->tags).xml_tags);
  memset(&doc->tags,0,0x5a0);
  return;
}

Assistant:

void TY_(FreeTags)( TidyDocImpl* doc )
{
    TidyTagImpl* tags = &doc->tags;

    tagsEmptyHash( doc, tags );
    TY_(FreeDeclaredTags)( doc, tagtype_null );
    FreeDict( doc, tags->xml_tags );

    /* get rid of dangling tag references */
    TidyClearMemory( tags, sizeof(TidyTagImpl) );

}